

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

int fiobj_hash_haskey(FIOBJ hash,FIOBJ key)

{
  size_t sVar1;
  uint64_t hash_value;
  FIOBJ FVar2;
  FIOBJ key_local;
  FIOBJ hash_local;
  
  if (hash != 0) {
    sVar1 = fiobj_type_is(hash,FIOBJ_T_HASH);
    if (sVar1 != 0) {
      hash_value = fiobj_obj2hash(key);
      FVar2 = fio_hash___find((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,key);
      return (int)(FVar2 != 0);
    }
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x141,"int fiobj_hash_haskey(const FIOBJ, FIOBJ)");
}

Assistant:

int fiobj_hash_haskey(const FIOBJ hash, FIOBJ key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, fiobj_obj2hash(key), key) !=
         FIOBJ_INVALID;
}